

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall gimage::Histogram::sumCols(Histogram *this,Histogram *rowhist)

{
  unsigned_long **ppuVar1;
  unsigned_long **ppuVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  
  setSize(rowhist,this->h,1,this->bs);
  clear(rowhist);
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->w;
  if (this->w < 1) {
    uVar3 = uVar4;
  }
  uVar5 = (ulong)(uint)this->h;
  if (this->h < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    ppuVar1 = this->row;
    ppuVar2 = rowhist->row;
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      ppuVar2[1][uVar4] = ppuVar2[1][uVar4] + ppuVar1[uVar4][uVar6];
    }
  }
  return;
}

Assistant:

void Histogram::sumCols(Histogram &rowhist) const
{
  rowhist.setSize(h, 1, bs);
  rowhist.clear();

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      rowhist(k, 1)+=row[k][i];
    }
  }
}